

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

void checksum_update(chksumwork_conflict *sumwrk,void *buff,size_t size)

{
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **pp_Var1;
  long lStack_8;
  
  if (sumwrk->alg == CKSUM_SHA1) {
    pp_Var1 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
    lStack_8 = 0x10;
  }
  else {
    if (sumwrk->alg != CKSUM_MD5) {
      return;
    }
    pp_Var1 = &__archive_digest.md5update;
    lStack_8 = 8;
  }
  (**pp_Var1)((archive_md5_ctx *)((long)&sumwrk->alg + lStack_8),buff,size);
  return;
}

Assistant:

static void
checksum_update(struct chksumwork *sumwrk, const void *buff, size_t size)
{

	switch (sumwrk->alg) {
	case CKSUM_NONE:
		break;
	case CKSUM_SHA1:
		archive_sha1_update(&(sumwrk->sha1ctx), buff, size);
		break;
	case CKSUM_MD5:
		archive_md5_update(&(sumwrk->md5ctx), buff, size);
		break;
	}
}